

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

void wabt::anon_unknown_1::ResolveFuncTypeWithEmptySignature(Module *module,FuncDeclaration *decl)

{
  FuncType *pFVar1;
  
  if (((decl->has_func_type == true) &&
      ((decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish)) &&
     ((decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    pFVar1 = Module::GetFuncType(module,&decl->type_var);
    if (pFVar1 != (FuncType *)0x0) {
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                (&(decl->sig).param_types,&(pFVar1->sig).param_types);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                (&(decl->sig).result_types,&(pFVar1->sig).result_types);
      return;
    }
  }
  return;
}

Assistant:

void ResolveFuncTypeWithEmptySignature(const Module& module,
                                       FuncDeclaration* decl) {
  // Resolve func type variables where the signature was not specified
  // explicitly, e.g.: (func (type 1) ...)
  if (decl->has_func_type && IsEmptySignature(decl->sig)) {
    const FuncType* func_type = module.GetFuncType(decl->type_var);
    if (func_type) {
      decl->sig = func_type->sig;
    }
  }

}